

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O2

void __thiscall
wallet::wallet_tests::wallet_sync_tx_invalid_state_test::test_method
          (wallet_sync_tx_invalid_state_test *this)

{
  RecursiveMutex *mutexIn;
  long lVar1;
  Chain *chain;
  element_type *peVar2;
  string label;
  MockableData records;
  Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  *this_00;
  T *__rhs;
  CWalletTx *pCVar3;
  MockableDatabase *pMVar4;
  iterator pvVar5;
  iterator pvVar6;
  Txid *__args;
  long in_FS_OFFSET;
  CTransactionRef tx;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  check_type cVar7;
  undefined1 in_stack_fffffffffffff838;
  undefined1 in_stack_fffffffffffff839 [23];
  undefined8 in_stack_fffffffffffff850;
  undefined1 in_stack_fffffffffffff858 [16];
  isminefilter local_790 [14];
  char *local_758;
  char *local_750;
  undefined1 *local_748;
  undefined1 *local_740;
  char *local_738;
  char *local_730;
  undefined1 *local_728;
  undefined1 *local_720;
  char *local_718;
  char *local_710;
  char *local_708;
  char *local_700;
  undefined1 *local_6f8;
  undefined1 *local_6f0;
  char *local_6e8;
  char *local_6e0;
  isminefilter local_6d4;
  char *local_6d0;
  char *local_6c8;
  undefined1 *local_6c0;
  undefined1 *local_6b8;
  char *local_6b0;
  char *local_6a8;
  char *local_6a0;
  char *local_698;
  undefined1 *local_690;
  undefined1 *local_688;
  char *local_680;
  char *local_678;
  undefined1 local_670 [24];
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock75;
  shared_count sStack_648;
  Txid good_tx_id;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock74;
  string local_5e0 [32];
  CMutableTransaction mtx;
  T op_dest;
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  local_518;
  CWallet wallet;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  chain = (this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_node.chain.
          _M_t.super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>.
          _M_t.super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
          super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>((string *)&mtx,"",(allocator<char> *)&op_dest);
  local_518._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_518._M_impl.super__Rb_tree_header._M_header;
  local_518._M_impl._0_8_ = 0;
  local_518._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_518._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_518._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_518._M_impl.super__Rb_tree_header._M_node_count = 0;
  records._M_t._M_impl._1_23_ = in_stack_fffffffffffff839;
  records._M_t._M_impl._0_1_ = in_stack_fffffffffffff838;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)in_stack_fffffffffffff850;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)in_stack_fffffffffffff858._0_8_;
  records._M_t._M_impl.super__Rb_tree_header._M_node_count = in_stack_fffffffffffff858._8_8_;
  local_518._M_impl.super__Rb_tree_header._M_header._M_right =
       local_518._M_impl.super__Rb_tree_header._M_header._M_left;
  CreateMockableWalletDatabase(records);
  CWallet::CWallet(&wallet,chain,(string *)&mtx,
                   (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                   )((long)local_670 + 0x10));
  if ((pointer)local_670._16_8_ != (pointer)0x0) {
    (**(code **)(*(long *)(((COutPoint *)local_670._16_8_)->hash).m_wrapped.super_base_blob<256U>.
                          m_data._M_elems + 8))();
  }
  local_670._16_8_ = (pointer)0x0;
  std::
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::~_Rb_tree(&local_518);
  std::__cxx11::string::~string((string *)&mtx);
  mutexIn = &wallet.cs_wallet;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&mtx,mutexIn,"wallet.cs_wallet",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x3cd,false);
  CWallet::SetWalletFlag(&wallet,0x400000000);
  CWallet::SetupDescriptorScriptPubKeyMans(&wallet);
  std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)&mtx);
  std::__cxx11::string::string<std::allocator<char>>(local_5e0,"",(allocator<char> *)&good_tx_id);
  label._1_23_ = in_stack_fffffffffffff839;
  label._M_dataplus._M_p._0_1_ = in_stack_fffffffffffff838;
  label.field_2._8_8_ = in_stack_fffffffffffff850;
  CWallet::GetNewDestination
            ((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
              *)&mtx,&wallet,BECH32M,label);
  this_00 = inline_assertion_check<true,util::Result<std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>>>
                      ((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
                        *)&mtx,
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                       ,0x3d3,"test_method","wallet.GetNewDestination(OutputType::BECH32M, \"\")");
  __rhs = util::
          Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
          ::value(this_00);
  std::__detail::__variant::
  _Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     *)&op_dest,
                    (_Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     *)__rhs);
  std::__detail::__variant::
  _Variant_storage<false,_bilingual_str,_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  ::~_Variant_storage((_Variant_storage<false,_bilingual_str,_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
                       *)&mtx);
  std::__cxx11::string::~string(local_5e0);
  CMutableTransaction::CMutableTransaction(&mtx);
  GetScriptForDestination((CScript *)&good_tx_id,&op_dest);
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<long_const&,CScript>
            ((vector<CTxOut,std::allocator<CTxOut>> *)&mtx.vout,&COIN,(CScript *)&good_tx_id);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&good_tx_id);
  RandomMixin<FastRandomContext>::rand256
            ((uint256 *)&criticalblock74,
             &(this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_rng.
              super_RandomMixin<FastRandomContext>);
  good_tx_id.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
       criticalblock74.super_unique_lock._M_device;
  good_tx_id.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] =
       criticalblock74.super_unique_lock._M_owns;
  good_tx_id.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] =
       criticalblock74.super_unique_lock._9_1_;
  good_tx_id.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] =
       criticalblock74.super_unique_lock._10_1_;
  good_tx_id.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] =
       criticalblock74.super_unique_lock._11_1_;
  good_tx_id.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] =
       criticalblock74.super_unique_lock._12_1_;
  good_tx_id.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] =
       criticalblock74.super_unique_lock._13_1_;
  good_tx_id.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] =
       criticalblock74.super_unique_lock._14_1_;
  good_tx_id.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] =
       criticalblock74.super_unique_lock._15_1_;
  criticalblock75.super_unique_lock._M_device =
       (mutex_type *)((ulong)criticalblock75.super_unique_lock._M_device._4_4_ << 0x20);
  std::vector<CTxIn,std::allocator<CTxIn>>::emplace_back<transaction_identifier<false>,int>
            ((vector<CTxIn,std::allocator<CTxIn>> *)&mtx,&good_tx_id,(int *)&criticalblock75);
  std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)local_670);
  criticalblock74.super_unique_lock._M_device = (mutex_type *)0x0;
  criticalblock74.super_unique_lock._M_owns = false;
  criticalblock74.super_unique_lock._9_7_ = 0;
  tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&good_tx_id;
  tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_670;
  pCVar3 = CWallet::AddToWallet
                     (&wallet,tx,(TxState *)&criticalblock74,(UpdateWalletTxFn *)&DAT_00000001,false
                      ,(bool)in_stack_fffffffffffff838);
  peVar2 = (pCVar3->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::_Function_base::~_Function_base((_Function_base *)&criticalblock74);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_670 + 8));
  pvVar5 = (iterator)0x3dc;
  pvVar6 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock74,mutexIn,"wallet.cs_wallet",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x3dc,false);
  __args = &peVar2->hash;
  pCVar3 = CWallet::GetWalletTx(&wallet,&__args->m_wrapped);
  local_680 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_678 = "";
  local_690 = &boost::unit_test::basic_cstring<char_const>::null;
  local_688 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x3de;
  file.m_begin = (iterator)&local_680;
  msg.m_end = pvVar6;
  msg.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_690,msg);
  good_tx_id.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
       good_tx_id.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  good_tx_id.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_011480b0;
  good_tx_id.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  good_tx_id.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ =
       (long)"\x05\x04\x03\x02\x01" + 5;
  local_6a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_698 = "";
  local_790[0] = 2;
  criticalblock75.super_unique_lock._M_device =
       (mutex_type *)CachedTxGetAvailableCredit(&wallet,pCVar3,local_790);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&good_tx_id,&local_6a0,0x3de,1,2,&criticalblock75,
             "CachedTxGetAvailableCredit(wallet, *wtx_to_spend)",&stack0xfffffffffffff850,"1 * COIN"
            );
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock74.super_unique_lock);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::clear(&mtx.vin);
  good_tx_id.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
       good_tx_id.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ & 0xffffffff00000000;
  std::vector<CTxIn,std::allocator<CTxIn>>::emplace_back<transaction_identifier<false>const&,int>
            ((vector<CTxIn,std::allocator<CTxIn>> *)&mtx,__args,(int *)&good_tx_id);
  std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)&good_tx_id);
  CWallet::transactionAddedToMempool(&wallet,(CTransactionRef *)&good_tx_id);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             (good_tx_id.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8));
  CMutableTransaction::GetHash(&good_tx_id,&mtx);
  pvVar5 = (iterator)0x3ec;
  pvVar6 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock75,mutexIn,"wallet.cs_wallet",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x3ec,false);
  pCVar3 = CWallet::GetWalletTx(&wallet,&good_tx_id.m_wrapped);
  local_6b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_6a8 = "";
  local_6c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x3ee;
  file_00.m_begin = (iterator)&local_6b0;
  msg_00.m_end = pvVar6;
  msg_00.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_6c0,
             msg_00);
  criticalblock74.super_unique_lock._8_8_ =
       criticalblock74.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock74.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_011480b0;
  local_6d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_6c8 = "";
  local_6d4 = 2;
  CachedTxGetAvailableCredit(&wallet,pCVar3,&local_6d4);
  pvVar5 = &stack0xfffffffffffff850;
  local_790[0] = 100000000;
  local_790[1] = 0;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&criticalblock74,&local_6d0,0x3ee,1,2,pvVar5,
             "CachedTxGetAvailableCredit(wallet, *new_wtx)",local_790,"1 * COIN");
  pCVar3 = CWallet::GetWalletTx(&wallet,&__args->m_wrapped);
  local_6e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_6e0 = "";
  local_6f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x3f2;
  file_01.m_begin = (iterator)&local_6e8;
  msg_01.m_end = pvVar5;
  msg_01.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_6f8,
             msg_01);
  criticalblock74.super_unique_lock._8_8_ =
       criticalblock74.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock74.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_011480b0;
  local_708 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_700 = "";
  local_6d4 = 2;
  CachedTxGetAvailableCredit(&wallet,pCVar3,&local_6d4);
  pvVar5 = &stack0xfffffffffffff850;
  local_790[0] = 0;
  local_790[1] = 0;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&criticalblock74,&local_708,0x3f2,1,2,pvVar5,
             "CachedTxGetAvailableCredit(wallet, *wtx_to_spend)",local_790,"0 * COIN");
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock75.super_unique_lock);
  pMVar4 = GetMockableDatabase(&wallet);
  pMVar4->m_pass = false;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::clear(&mtx.vin);
  criticalblock74.super_unique_lock._M_device =
       (mutex_type *)((ulong)criticalblock74.super_unique_lock._M_device & 0xffffffff00000000);
  std::vector<CTxIn,std::allocator<CTxIn>>::emplace_back<transaction_identifier<false>const&,int>
            ((vector<CTxIn,std::allocator<CTxIn>> *)&mtx,&good_tx_id,(int *)&criticalblock74);
  local_718 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_710 = "";
  local_728 = &boost::unit_test::basic_cstring<char_const>::null;
  local_720 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x3fe;
  file_02.m_begin = (iterator)&local_718;
  msg_02.m_end = pvVar5;
  msg_02.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_728,
             msg_02);
  std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)&criticalblock74)
  ;
  CWallet::transactionAddedToMempool(&wallet,(CTransactionRef *)&criticalblock74);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &criticalblock74.super_unique_lock._M_owns);
  local_738 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_730 = "";
  local_748 = &boost::unit_test::basic_cstring<char_const>::null;
  local_740 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar7 = 0x672260;
  file_03.m_end = (iterator)0x3fe;
  file_03.m_begin = (iterator)&local_738;
  msg_03.m_end = pvVar5;
  msg_03.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_748,
             msg_03);
  criticalblock75.super_unique_lock._M_device =
       (mutex_type *)((ulong)criticalblock75.super_unique_lock._M_device & 0xffffffffffffff00);
  criticalblock75.super_unique_lock._M_owns = false;
  criticalblock75.super_unique_lock._9_7_ = 0;
  sStack_648.pi_ = (sp_counted_base *)0x0;
  criticalblock74.super_unique_lock._8_8_ =
       criticalblock74.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock74.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_011489c8;
  local_758 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_750 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&criticalblock75,(lazy_ostream *)&criticalblock74,1,1,WARN,_cVar7,
             (size_t)&local_758,0x3fe);
  boost::detail::shared_count::~shared_count(&stack0xfffffffffffff9b8);
  CMutableTransaction::~CMutableTransaction(&mtx);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&op_dest);
  CWallet::~CWallet(&wallet);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(wallet_sync_tx_invalid_state_test, TestingSetup)
{
    CWallet wallet(m_node.chain.get(), "", CreateMockableWalletDatabase());
    {
        LOCK(wallet.cs_wallet);
        wallet.SetWalletFlag(WALLET_FLAG_DESCRIPTORS);
        wallet.SetupDescriptorScriptPubKeyMans();
    }

    // Add tx to wallet
    const auto op_dest{*Assert(wallet.GetNewDestination(OutputType::BECH32M, ""))};

    CMutableTransaction mtx;
    mtx.vout.emplace_back(COIN, GetScriptForDestination(op_dest));
    mtx.vin.emplace_back(Txid::FromUint256(m_rng.rand256()), 0);
    const auto& tx_id_to_spend = wallet.AddToWallet(MakeTransactionRef(mtx), TxStateInMempool{})->GetHash();

    {
        // Cache and verify available balance for the wtx
        LOCK(wallet.cs_wallet);
        const CWalletTx* wtx_to_spend = wallet.GetWalletTx(tx_id_to_spend);
        BOOST_CHECK_EQUAL(CachedTxGetAvailableCredit(wallet, *wtx_to_spend), 1 * COIN);
    }

    // Now the good case:
    // 1) Add a transaction that spends the previously created transaction
    // 2) Verify that the available balance of this new tx and the old one is updated (prev tx is marked dirty)

    mtx.vin.clear();
    mtx.vin.emplace_back(tx_id_to_spend, 0);
    wallet.transactionAddedToMempool(MakeTransactionRef(mtx));
    const auto good_tx_id{mtx.GetHash()};

    {
        // Verify balance update for the new tx and the old one
        LOCK(wallet.cs_wallet);
        const CWalletTx* new_wtx = wallet.GetWalletTx(good_tx_id.ToUint256());
        BOOST_CHECK_EQUAL(CachedTxGetAvailableCredit(wallet, *new_wtx), 1 * COIN);

        // Now the old wtx
        const CWalletTx* wtx_to_spend = wallet.GetWalletTx(tx_id_to_spend);
        BOOST_CHECK_EQUAL(CachedTxGetAvailableCredit(wallet, *wtx_to_spend), 0 * COIN);
    }

    // Now the bad case:
    // 1) Make db always fail
    // 2) Try to add a transaction that spends the previously created transaction and
    //    verify that we are not moving forward if the wallet cannot store it
    GetMockableDatabase(wallet).m_pass = false;
    mtx.vin.clear();
    mtx.vin.emplace_back(good_tx_id, 0);
    BOOST_CHECK_EXCEPTION(wallet.transactionAddedToMempool(MakeTransactionRef(mtx)),
                          std::runtime_error,
                          HasReason("DB error adding transaction to wallet, write failed"));
}